

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true>>>
               (Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>
                *mb)

{
  uint uVar1;
  pointer puVar2;
  pointer puVar3;
  pointer pvVar4;
  pointer pvVar5;
  void *__s2;
  int iVar6;
  long lVar7;
  size_t sVar8;
  pointer pvVar9;
  uint *puVar10;
  bool bVar11;
  vector<unsigned_int,_std::allocator<unsigned_int>_> tmp;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_228;
  undefined4 **local_210;
  RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  *local_200;
  undefined **local_1f8;
  char *local_1f0;
  shared_count sStack_1e8;
  char *local_1e0;
  undefined **local_1d8;
  undefined1 local_1d0;
  undefined8 *local_1c8;
  undefined ***local_1c0;
  undefined **local_1b8;
  char *local_1b0;
  shared_count sStack_1a8;
  undefined4 local_19c;
  char *local_198;
  char *local_190;
  undefined1 *local_188;
  undefined1 *local_180;
  char *local_178;
  char *local_170;
  long local_168;
  undefined4 *local_160;
  long *local_158;
  char *local_150;
  char *local_148;
  undefined1 *local_140;
  undefined1 *local_138;
  char *local_130;
  char *local_128;
  char *local_120;
  char *local_118;
  undefined1 *local_110;
  undefined1 *local_108;
  char *local_100;
  char *local_f8;
  char *local_f0;
  char *local_e8;
  undefined1 *local_e0;
  undefined1 *local_d8;
  char *local_d0;
  char *local_c8;
  char *local_c0;
  char *local_b8;
  undefined1 *local_b0;
  undefined1 *local_a8;
  char *local_a0;
  char *local_98;
  char *local_90;
  char *local_88;
  undefined1 *local_80;
  undefined1 *local_78;
  char *local_70;
  char *local_68;
  undefined1 *local_60;
  undefined1 *local_58;
  char *local_50;
  char *local_48;
  char *local_40;
  char *local_38;
  
  local_200 = &(mb->matrix_).super_RU_representative_cycles_option;
  Gudhi::persistence_matrix::
  RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
  ::update_representative_cycles(local_200);
  if ((mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
      super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    Gudhi::persistence_matrix::
    RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
    ::update_representative_cycles(local_200);
  }
  local_50 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_48 = "";
  local_60 = &boost::unit_test::basic_cstring<char_const>::null;
  local_58 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_50,0x9c7);
  local_1f0 = (char *)((ulong)local_1f0 & 0xffffffffffffff00);
  local_1f8 = &PTR__lazy_ostream_00250f50;
  sStack_1e8.pi_ = (sp_counted_base *)&boost::unit_test::lazy_ostream::inst;
  local_1e0 = "";
  lVar7 = (long)(mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
                super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  local_168 = (lVar7 >> 3) * -0x5555555555555555;
  local_158 = &local_168;
  local_160 = &local_19c;
  local_19c = 5;
  local_1b8 = (undefined **)CONCAT71(local_1b8._1_7_,lVar7 == 0x78);
  local_1b0 = (char *)0x0;
  sStack_1a8.pi_ = (sp_counted_base *)0x0;
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_1c0 = (undefined ***)&local_158;
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00250f90;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_210 = &local_160;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish =
       (pointer)((ulong)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish & 0xffffffffffffff00);
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)&PTR__lazy_ostream_00250f10;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)&boost::unit_test::lazy_ostream::inst;
  boost::test_tools::tt_detail::report_assertion
            (&local_1b8,&local_1f8,&local_40,0x9c7,1,2,2,"cycles.size()",&local_1d8,"5",&local_228);
  boost::detail::shared_count::~shared_count(&sStack_1a8);
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (uint *)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (uint *)0x0;
  local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
  local_1d8 = (undefined **)((ulong)local_1d8 & 0xffffffff00000000);
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
            (&local_228,(iterator)0x0,(uint *)&local_1d8);
  local_70 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_68 = "";
  local_80 = &boost::unit_test::basic_cstring<char_const>::null;
  local_78 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_70,0x9cc);
  pvVar9 = (local_200->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl;
  puVar3 = *(pointer *)
            ((long)&(pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>).
                    _M_impl + 8);
  sVar8 = (long)puVar3 - (long)puVar2;
  if (sVar8 == (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(puVar2,local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar8);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,bVar11);
  local_1f0 = (char *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1b8 = (undefined **)0x20fe98;
  local_1b0 = "";
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00251150;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_90 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_88 = "";
  local_1c0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  *local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 1;
  local_a0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_98 = "";
  local_b0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_a8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_a0,0x9ce);
  pvVar9 = (local_200->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &pvVar9[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&pvVar9[1].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  sVar8 = (long)puVar3 - (long)puVar2;
  if (sVar8 == (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(puVar2,local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar8);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,bVar11);
  local_1f0 = (char *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1b8 = (undefined **)0x20fea9;
  local_1b0 = "";
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00251150;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_c0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_b8 = "";
  local_1c0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  *local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 2;
  local_d0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_c8 = "";
  local_e0 = &boost::unit_test::basic_cstring<char_const>::null;
  local_d8 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_d0,0x9d0);
  pvVar9 = (local_200->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &pvVar9[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&pvVar9[2].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  sVar8 = (long)puVar3 - (long)puVar2;
  if (sVar8 == (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(puVar2,local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar8);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,bVar11);
  local_1f0 = (char *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1b8 = (undefined **)0x20feba;
  local_1b0 = "";
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00251150;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_f0 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_e8 = "";
  local_1c0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  *local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
   super__Vector_impl_data._M_start = 3;
  local_1d8._0_4_ = 4;
  if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_228,
               (iterator)
               local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_1d8);
  }
  else {
    *local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 4;
    local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_1d8 = (undefined **)CONCAT44(local_1d8._4_4_,5);
  if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_228,
               (iterator)
               local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_1d8);
  }
  else {
    *local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 5;
    local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_100 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_f8 = "";
  local_110 = &boost::unit_test::basic_cstring<char_const>::null;
  local_108 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_100,0x9d4);
  pvVar9 = (local_200->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &pvVar9[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&pvVar9[3].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  sVar8 = (long)puVar3 - (long)puVar2;
  if (sVar8 == (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(puVar2,local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar8);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,bVar11);
  local_1f0 = (char *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1b8 = (undefined **)0x20fecb;
  local_1b0 = "";
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00251150;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_120 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_118 = "";
  local_1c0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start) {
    local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_start;
  }
  local_1d8 = (undefined **)CONCAT44(local_1d8._4_4_,7);
  if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish ==
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
              (&local_228,
               (iterator)
               local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_finish,(uint *)&local_1d8);
  }
  else {
    *local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
     super__Vector_impl_data._M_finish = 7;
    local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
         super__Vector_impl_data._M_finish + 1;
  }
  local_130 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_128 = "";
  local_140 = &boost::unit_test::basic_cstring<char_const>::null;
  local_138 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_130,0x9d7);
  pvVar9 = (local_200->representativeCycles_).
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  puVar2 = *(pointer *)
            &pvVar9[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
  puVar3 = *(pointer *)
            ((long)&pvVar9[4].super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl + 8);
  sVar8 = (long)puVar3 - (long)puVar2;
  if (sVar8 == (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                     _M_impl.super__Vector_impl_data._M_start) {
    if (puVar3 == puVar2) {
      bVar11 = true;
    }
    else {
      iVar6 = bcmp(puVar2,local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start,sVar8);
      bVar11 = iVar6 == 0;
    }
  }
  else {
    bVar11 = false;
  }
  local_1f8 = (undefined **)CONCAT71(local_1f8._1_7_,bVar11);
  local_1f0 = (char *)0x0;
  sStack_1e8.pi_ = (sp_counted_base *)0x0;
  local_1b8 = (undefined **)0x20fedc;
  local_1b0 = "";
  local_1d0 = 0;
  local_1d8 = &PTR__lazy_ostream_00251150;
  local_1c8 = &boost::unit_test::lazy_ostream::inst;
  local_150 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_148 = "";
  local_1c0 = &local_1b8;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_1e8);
  if (local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start != (uint *)0x0) {
    operator_delete(local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start,
                    (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                          _M_impl.super__Vector_impl_data._M_start);
  }
  pvVar9 = (mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pvVar4 = (mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
           super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (pvVar9 != pvVar4) {
    puVar10 = &((mb->matrix_).super_RU_pairing_option.barcode_.
                super__Vector_base<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>,_std::allocator<Gudhi::persistence_matrix::Persistence_interval<int,_unsigned_int>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->birth;
    do {
      local_178 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_170 = "";
      local_188 = &boost::unit_test::basic_cstring<char_const>::null;
      local_180 = &boost::unit_test::basic_cstring<char_const>::null;
      boost::unit_test::unit_test_log_t::set_checkpoint
                (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_178,0x9ee,&local_188)
      ;
      if ((mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start ==
          (mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
          super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        Gudhi::persistence_matrix::
        RU_representative_cycles<Gudhi::persistence_matrix::Matrix<RU_rep_options<false,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true>_>_>
        ::update_representative_cycles(local_200);
      }
      pvVar5 = (mb->matrix_).super_RU_representative_cycles_option.representativeCycles_.
               super__Vector_base<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::allocator<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = (mb->matrix_).super_RU_representative_cycles_option.birthToCycle_.
              super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_start[*puVar10];
      puVar2 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      puVar3 = (pvVar9->super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>)._M_impl.
               super__Vector_impl_data._M_finish;
      sVar8 = (long)puVar3 - (long)puVar2;
      __s2 = *(void **)&pvVar5[uVar1].
                        super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl;
      if (sVar8 == (long)*(pointer *)
                          ((long)&pvVar5[uVar1].
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl + 8) - (long)__s2) {
        if (puVar3 == puVar2) {
          bVar11 = true;
        }
        else {
          iVar6 = bcmp(puVar2,__s2,sVar8);
          bVar11 = iVar6 == 0;
        }
      }
      else {
        bVar11 = false;
      }
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_start =
           (pointer)CONCAT71(local_228.
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start._1_7_,bVar11);
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish = (uint *)0x0;
      local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
      local_1f8 = (undefined **)0x20feed;
      local_1f0 = "";
      local_1d0 = 0;
      local_1d8 = &PTR__lazy_ostream_00251150;
      local_1c8 = &boost::unit_test::lazy_ostream::inst;
      local_1c0 = &local_1f8;
      local_198 = 
      "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
      ;
      local_190 = "";
      boost::test_tools::tt_detail::report_assertion(&local_228,&local_1d8,&local_198,0x9ee,1,0,0);
      boost::detail::shared_count::~shared_count
                ((shared_count *)
                 &local_228.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      pvVar9 = pvVar9 + 1;
      puVar10 = puVar10 + 3;
    } while (pvVar9 != pvVar4);
  }
  return;
}

Assistant:

void test_representative_cycles(Matrix& mb) {
  mb.update_representative_cycles();

  const auto& cycles = mb.get_representative_cycles();
  BOOST_CHECK_EQUAL(cycles.size(), 5);

  if constexpr (Matrix::Option_list::is_of_boundary_type) {
    std::vector<unsigned int> tmp;
    tmp.push_back(0);
    BOOST_CHECK(cycles[0] == tmp);
    tmp[0] = 1;
    BOOST_CHECK(cycles[1] == tmp);
    tmp[0] = 2;
    BOOST_CHECK(cycles[2] == tmp);
    tmp[0] = 3;
    tmp.push_back(4);
    tmp.push_back(5);
    BOOST_CHECK(cycles[3] == tmp);
    tmp.clear();
    tmp.push_back(7);
    BOOST_CHECK(cycles[4] == tmp);
  } else {
    std::vector<unsigned int> tmp;
    tmp.push_back(0);
    BOOST_CHECK(cycles[0] == tmp);
    tmp.push_back(1);
    BOOST_CHECK(cycles[1] == tmp);
    tmp[1] = 2;
    BOOST_CHECK(cycles[2] == tmp);
    tmp[0] = 3;
    tmp[1] = 4;
    tmp.push_back(5);
    BOOST_CHECK(cycles[3] == tmp);
    tmp[0] = 0;
    tmp[1] = 7;
    tmp.pop_back();
    BOOST_CHECK(cycles[4] == tmp);
  }

  if constexpr (Matrix::Option_list::has_column_pairings) {
    const auto& barcode = mb.get_current_barcode();
    auto it = barcode.begin();
    for (auto& cycle : cycles) {
      BOOST_CHECK(cycle == mb.get_representative_cycle(*it));
      ++it;
    }
  }
}